

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall ThreadContext::RegisterExpirableObject(ThreadContext *this,ExpirableObject *object)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  ExpirableObject **registrationHandle;
  
  if (this->expirableObjectList == (ExpirableObjectList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbde,"(this->expirableObjectList)","this->expirableObjectList");
    if (!bVar2) goto LAB_007be41a;
    *puVar3 = 0;
  }
  pvVar4 = ExpirableObject::GetRegistrationHandle(object);
  if (pvVar4 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbdf,"(object->GetRegistrationHandle() == nullptr)",
                       "object->GetRegistrationHandle() == nullptr");
    if (!bVar2) {
LAB_007be41a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  registrationHandle =
       DList<ExpirableObject_*,_Memory::ArenaAllocator,_RealCount>::PrependNode
                 (this->expirableObjectList);
  *registrationHandle = object;
  ExpirableObject::SetRegistrationHandle(object,registrationHandle);
  if (DAT_015d346a == '\x01') {
    Output::Trace(ExpirableCollectPhase,L"Registered 0x%p\n",object);
  }
  this->numExpirableObjects = this->numExpirableObjects + 1;
  return;
}

Assistant:

void
ThreadContext::RegisterExpirableObject(ExpirableObject* object)
{
    Assert(this->expirableObjectList);
    Assert(object->GetRegistrationHandle() == nullptr);

    ExpirableObject** registrationData = this->expirableObjectList->PrependNode();
    (*registrationData) = object;
    object->SetRegistrationHandle((void*) registrationData);
    OUTPUT_VERBOSE_TRACE(Js::ExpirableCollectPhase, _u("Registered 0x%p\n"), object);

    numExpirableObjects++;
}